

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool container_iterator_lower_bound
                (container_t *c,uint8_t typecode,roaring_container_iterator_t *it,
                uint16_t *value_out,uint16_t val)

{
  ushort uVar1;
  int iVar2;
  ulong uVar3;
  int *piVar4;
  uint8_t uVar5;
  long lVar6;
  ulong uVar7;
  short sVar8;
  ushort uVar9;
  undefined7 in_register_00000031;
  uint uVar10;
  uint uVar11;
  int iVar12;
  
  piVar4 = (int *)c;
  uVar5 = typecode;
  if ((int)CONCAT71(in_register_00000031,typecode) == 4) {
    uVar5 = *(uint8_t *)((long)c + 8);
    piVar4 = *c;
  }
  if (uVar5 == '\x03') {
    lVar6 = (long)*piVar4;
    if (lVar6 == 0) goto LAB_00110d35;
    uVar9 = *(short *)(*(long *)(piVar4 + 2) + -2 + lVar6 * 4) +
            *(short *)(*(long *)(piVar4 + 2) + -4 + lVar6 * 4);
  }
  else {
    if (uVar5 != '\x02') {
      sVar8 = -1;
      uVar7 = 0x400;
LAB_00110d22:
      uVar11 = (int)uVar7 - 1;
      uVar7 = (ulong)uVar11;
      uVar3 = *(ulong *)(*(long *)(piVar4 + 2) + uVar7 * 8);
      if (uVar3 == 0) goto code_r0x00110d2d;
      lVar6 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      uVar9 = sVar8 - ((ushort)lVar6 ^ 0x3f);
      goto LAB_00110d42;
    }
    if ((long)*piVar4 == 0) {
LAB_00110d35:
      uVar9 = 0;
    }
    else {
      uVar9 = *(ushort *)(*(long *)(piVar4 + 2) + -2 + (long)*piVar4 * 2);
    }
  }
LAB_00110d42:
  if (uVar9 < val) goto LAB_00110e29;
  if (typecode == '\x03') {
    lVar6 = *(long *)((long)c + 8);
    iVar2 = *c;
    if (iVar2 < 1) {
LAB_00110df1:
      uVar11 = 0;
LAB_00110df3:
      uVar10 = 0xffffffff;
      if ((int)uVar11 < iVar2) {
        uVar10 = uVar11;
      }
    }
    else {
      iVar12 = iVar2 + -1;
      uVar11 = 0;
      do {
        uVar10 = iVar12 + uVar11 >> 1;
        uVar1 = *(ushort *)(lVar6 + (ulong)uVar10 * 4);
        if (uVar1 < val) {
          uVar11 = uVar10 + 1;
        }
        else {
          if (uVar1 <= val) goto LAB_00110dfd;
          iVar12 = uVar10 - 1;
        }
      } while ((int)uVar11 <= iVar12);
      if (uVar11 == 0) goto LAB_00110df1;
      uVar10 = uVar11 - 1;
      if ((int)(uint)*(ushort *)(lVar6 + 2 + (ulong)uVar10 * 4) <
          (int)((uint)val - (uint)*(ushort *)(lVar6 + (ulong)uVar10 * 4))) goto LAB_00110df3;
    }
LAB_00110dfd:
    it->index = uVar10;
    uVar1 = *(ushort *)(lVar6 + (long)(int)uVar10 * 4);
    uVar11 = (uint)uVar1;
    if (uVar1 <= val) {
      uVar11 = (uint)val;
    }
  }
  else if (typecode == '\x02') {
    lVar6 = *(long *)((long)c + 8);
    iVar2 = *c;
    if (iVar2 < 1) {
      uVar11 = 0;
    }
    else {
      iVar12 = iVar2 + -1;
      uVar11 = 0;
      do {
        uVar10 = iVar12 + uVar11 >> 1;
        uVar1 = *(ushort *)(lVar6 + (ulong)(iVar12 + uVar11 & 0xfffffffe));
        if (uVar1 < val) {
          uVar11 = uVar10 + 1;
        }
        else {
          if (uVar1 <= val) goto LAB_00110e1b;
          iVar12 = uVar10 - 1;
        }
      } while ((int)uVar11 <= iVar12);
    }
    uVar10 = 0xffffffff;
    if ((int)uVar11 < iVar2) {
      uVar10 = uVar11;
    }
LAB_00110e1b:
    it->index = uVar10;
    uVar11 = (uint)*(ushort *)(lVar6 + (long)(int)uVar10 * 2);
  }
  else {
    uVar11 = bitset_container_index_equalorlarger((bitset_container_t *)c,val);
    it->index = uVar11;
  }
  *value_out = (uint16_t)uVar11;
LAB_00110e29:
  return val <= uVar9;
code_r0x00110d2d:
  sVar8 = sVar8 + -0x40;
  if (uVar11 < 2) goto LAB_00110d35;
  goto LAB_00110d22;
}

Assistant:

bool container_iterator_lower_bound(const container_t *c, uint8_t typecode,
                                    roaring_container_iterator_t *it,
                                    uint16_t *value_out, uint16_t val) {
    if (val > container_maximum(c, typecode)) {
        return false;
    }
    switch (typecode) {
        case BITSET_CONTAINER_TYPE: {
            const bitset_container_t *bc = const_CAST_bitset(c);
            it->index = bitset_container_index_equalorlarger(bc, val);
            *value_out = it->index;
            return true;
        }
        case ARRAY_CONTAINER_TYPE: {
            const array_container_t *ac = const_CAST_array(c);
            it->index = array_container_index_equalorlarger(ac, val);
            *value_out = ac->array[it->index];
            return true;
        }
        case RUN_CONTAINER_TYPE: {
            const run_container_t *rc = const_CAST_run(c);
            it->index = run_container_index_equalorlarger(rc, val);
            if (rc->runs[it->index].value <= val) {
                *value_out = val;
            } else {
                *value_out = rc->runs[it->index].value;
            }
            return true;
        }
        default:
            assert(false);
            roaring_unreachable;
            return false;
    }
}